

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

void Imath_3_2::jacobiEigenSolver<double>
               (Matrix44<double> *A,Vec4<double> *S,Matrix44<double> *V,double tol)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  double *pdVar4;
  Matrix44<double> *in_RDX;
  Vec4<double> *in_RSI;
  Matrix44<double> *in_RDI;
  double in_XMM0_Qa;
  BaseType_conflict BVar5;
  int i_1;
  bool changed;
  Vec4<double> Z;
  int numIter;
  double absTol;
  int maxIter;
  int i;
  bool local_89;
  Matrix44<double> *in_stack_ffffffffffffff80;
  bool local_75;
  bool local_74;
  bool local_73;
  bool local_72;
  bool local_71;
  int local_60;
  Vec4<double> local_58;
  int local_34;
  double local_30;
  undefined4 local_28;
  int local_24;
  double local_20;
  Vec4<double> *local_10;
  Matrix44<double> *local_8;
  
  local_20 = in_XMM0_Qa;
  local_10 = in_RSI;
  local_8 = in_RDI;
  Matrix44<double>::makeIdentity(in_RDX);
  for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
    pdVar4 = Matrix44<double>::operator[](local_8,local_24);
    dVar1 = pdVar4[local_24];
    pdVar4 = Vec4<double>::operator[](local_10,local_24);
    *pdVar4 = dVar1;
  }
  local_28 = 0x14;
  BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<double>>
                    (in_stack_ffffffffffffff80);
  local_30 = local_20 * BVar5;
  if ((local_30 != 0.0) || (NAN(local_30))) {
    local_34 = 0;
    do {
      local_34 = local_34 + 1;
      Vec4<double>::Vec4(&local_58,0.0,0.0,0.0,0.0);
      bVar2 = (anonymous_namespace)::jacobiRotation<0,1,2,3,double>
                        ((Matrix44<double> *)Z.w,(Matrix44<double> *)Z.z,(Vec4<double> *)Z.y,Z.x);
      bVar3 = (anonymous_namespace)::jacobiRotation<0,2,1,3,double>
                        ((Matrix44<double> *)Z.w,(Matrix44<double> *)Z.z,(Vec4<double> *)Z.y,Z.x);
      local_71 = true;
      if (!bVar3) {
        local_71 = bVar2;
      }
      bVar2 = (anonymous_namespace)::jacobiRotation<0,3,1,2,double>
                        ((Matrix44<double> *)Z.w,(Matrix44<double> *)Z.z,(Vec4<double> *)Z.y,Z.x);
      local_72 = true;
      if (!bVar2) {
        local_72 = local_71;
      }
      bVar2 = (anonymous_namespace)::jacobiRotation<1,2,0,3,double>
                        ((Matrix44<double> *)Z.w,(Matrix44<double> *)Z.z,(Vec4<double> *)Z.y,Z.x);
      local_73 = true;
      if (!bVar2) {
        local_73 = local_72;
      }
      bVar2 = (anonymous_namespace)::jacobiRotation<1,3,0,2,double>
                        ((Matrix44<double> *)Z.w,(Matrix44<double> *)Z.z,(Vec4<double> *)Z.y,Z.x);
      local_74 = true;
      if (!bVar2) {
        local_74 = local_73;
      }
      bVar2 = (anonymous_namespace)::jacobiRotation<2,3,0,1,double>
                        ((Matrix44<double> *)Z.w,(Matrix44<double> *)Z.z,(Vec4<double> *)Z.y,Z.x);
      local_75 = true;
      if (!bVar2) {
        local_75 = local_74;
      }
      for (local_60 = 0; local_60 < 4; local_60 = local_60 + 1) {
        pdVar4 = Vec4<double>::operator[](&local_58,local_60);
        dVar1 = *pdVar4;
        pdVar4 = Vec4<double>::operator[](local_10,local_60);
        in_stack_ffffffffffffff80 = (Matrix44<double> *)(dVar1 + *pdVar4);
        *pdVar4 = (double)in_stack_ffffffffffffff80;
        pdVar4 = Matrix44<double>::operator[](local_8,local_60);
        pdVar4[local_60] = (double)in_stack_ffffffffffffff80;
      }
      if (local_75 == false) {
        return;
      }
      BVar5 = (anonymous_namespace)::maxOffDiagSymm<Imath_3_2::Matrix44<double>>
                        (in_stack_ffffffffffffff80);
      local_89 = local_30 < BVar5 && local_34 < 0x14;
    } while (local_89);
  }
  return;
}

Assistant:

void
jacobiEigenSolver (Matrix44<T>& A, Vec4<T>& S, Matrix44<T>& V, const T tol)
{
    V.makeIdentity ();

    for (int i = 0; i < 4; ++i)
    {
        S[i] = A[i][i];
    }

    const int maxIter =
        20; // In case we get really unlucky, prevents infinite loops
    const T absTol =
        tol * maxOffDiagSymm (A); // Tolerance is in terms of the maximum
    if (absTol != 0)              // _off-diagonal_ entry.
    {
        int numIter = 0;
        do
        {
            ++numIter;
            Vec4<T> Z (0, 0, 0, 0);
            bool    changed = jacobiRotation<0, 1, 2, 3> (A, V, Z, tol);
            changed = jacobiRotation<0, 2, 1, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<0, 3, 1, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 2, 0, 3> (A, V, Z, tol) || changed;
            changed = jacobiRotation<1, 3, 0, 2> (A, V, Z, tol) || changed;
            changed = jacobiRotation<2, 3, 0, 1> (A, V, Z, tol) || changed;
            for (int i = 0; i < 4; ++i)
            {
                A[i][i] = S[i] += Z[i];
            }
            if (!changed) break;
        } while (maxOffDiagSymm (A) > absTol && numIter < maxIter);
    }
}